

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::CheckFortran(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  ostream *poVar1;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  ostringstream e;
  cmMakefile *mf_local;
  cmGlobalNinjaGenerator *this_local;
  
  if (this->NinjaSupportsDyndeps == 1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    if (this->NinjaSupportsDyndeps == 0) {
      std::operator+(&local_1d8,
                     "The Ninja generator does not support Fortran using Ninja version\n  ",
                     &this->NinjaVersion);
      std::operator+(&local_1b8,&local_1d8,
                     "\ndue to lack of required features.  Kitware has implemented the required features but as of this version of CMake they have not been integrated to upstream ninja.  Pending integration, Kitware maintains a branch at:\n  https://github.com/Kitware/ninja/tree/features-for-fortran#readme\nwith the required features.  One may build ninja from that branch to get support for Fortran."
                    );
      std::operator<<((ostream *)local_198,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      std::operator+(&local_228,
                     "The Ninja generator in this version of CMake does not support Fortran using Ninja version\n  "
                     ,&this->NinjaVersion);
      std::operator+(&local_208,&local_228,"\nbecause its \'dyndep\' feature version is ");
      poVar1 = std::operator<<((ostream *)local_198,(string *)&local_208);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->NinjaSupportsDyndeps);
      std::operator<<(poVar1,
                      ".  This version of CMake is aware only of \'dyndep\' feature version 1.");
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
    }
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckFortran(cmMakefile* mf) const
{
  if (this->NinjaSupportsDyndeps == 1) {
    return true;
  }

  std::ostringstream e;
  if (this->NinjaSupportsDyndeps == 0) {
    /* clang-format off */
    e <<
      "The Ninja generator does not support Fortran using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "due to lack of required features.  "
      "Kitware has implemented the required features but as of this version "
      "of CMake they have not been integrated to upstream ninja.  "
      "Pending integration, Kitware maintains a branch at:\n"
      "  https://github.com/Kitware/ninja/tree/features-for-fortran#readme\n"
      "with the required features.  "
      "One may build ninja from that branch to get support for Fortran."
      ;
    /* clang-format on */
  } else {
    /* clang-format off */
    e <<
      "The Ninja generator in this version of CMake does not support Fortran "
      "using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "because its 'dyndep' feature version is " <<
      this->NinjaSupportsDyndeps << ".  "
      "This version of CMake is aware only of 'dyndep' feature version 1."
      ;
    /* clang-format on */
  }
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccured();
  return false;
}